

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_async_function_free(JSRuntime *rt,JSAsyncFunctionData *s)

{
  int iVar1;
  JSRuntime *in_RSI;
  JSAsyncFunctionData *in_stack_ffffffffffffffe8;
  
  iVar1 = *(int *)&(in_RSI->mf).js_malloc + -1;
  *(int *)&(in_RSI->mf).js_malloc = iVar1;
  if (iVar1 == 0) {
    js_async_function_free0(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void js_async_function_free(JSRuntime *rt, JSAsyncFunctionData *s)
{
    if (--s->header.ref_count == 0) {
        js_async_function_free0(rt, s);
    }
}